

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatImage.cpp
# Opt level: O3

Image * __thiscall nv::FloatImage::createImage(FloatImage *this,uint base_component,uint num)

{
  float *pfVar1;
  int iVar2;
  AutoPtr<nv::Image> this_00;
  anon_union_4_2_12391d8d_for_Color32_0 *paVar3;
  ulong uVar4;
  undefined4 in_register_00000014;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint idx;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint8 rgba [4];
  AutoPtr<nv::Image> img;
  uint local_58;
  uint local_54;
  AutoPtr<nv::Image> local_50;
  ulong local_48;
  FloatImage *local_40;
  ulong local_38;
  
  local_48 = CONCAT44(in_register_00000014,num);
  if ((4 < num) &&
     (iVar2 = nvAbort("num <= 4",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvimage/FloatImage.cpp"
                      ,0x5b,"Image *nv::FloatImage::createImage(uint, uint) const"), iVar2 == 1)) {
    raise(5);
  }
  if ((this->m_componentNum < (int)local_48 + base_component) &&
     (iVar2 = nvAbort("base_component + num <= m_componentNum",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvimage/FloatImage.cpp"
                      ,0x5c,"Image *nv::FloatImage::createImage(uint, uint) const"), iVar2 == 1)) {
    raise(5);
  }
  this_00.m_ptr = (Image *)operator_new(0x18);
  Image::Image(this_00.m_ptr);
  local_50.m_ptr = this_00.m_ptr;
  Image::allocate(this_00.m_ptr,(uint)this->m_width,(uint)this->m_height);
  uVar7 = (uint)this->m_height * (uint)this->m_width;
  if (uVar7 != 0) {
    uVar8 = local_48 & 0xffffffff;
    uVar6 = base_component * this->m_width * (uint)this->m_height;
    idx = 0;
    local_40 = this;
    do {
      uVar4 = (ulong)uVar6;
      local_58 = 0xff000000;
      local_38 = uVar4;
      if ((int)local_48 == 0) {
        local_54 = 0xff000000;
        uVar10 = 0;
        uVar6 = 0;
        uVar9 = 0;
      }
      else {
        pfVar1 = local_40->m_mem;
        uVar5 = 0;
        do {
          iVar2 = (int)(pfVar1[uVar4] * 255.0);
          if (iVar2 < 1) {
            iVar2 = 0;
          }
          if (0xfe < iVar2) {
            iVar2 = 0xff;
          }
          *(char *)((long)&local_58 + uVar5) = (char)iVar2;
          uVar5 = uVar5 + 1;
          uVar4 = (ulong)((int)uVar4 + uVar7);
        } while (uVar8 != uVar5);
        uVar10 = local_58 >> 0x10 & 0xff;
        local_54 = local_58 & 0xff000000;
        uVar9 = (local_58 & 0xff) << 0x10;
        uVar6 = (local_58 >> 8 & 0xff) << 8;
      }
      paVar3 = &Image::pixel(local_50.m_ptr,idx)->field_0;
      *paVar3 = (anon_union_4_2_12391d8d_for_Color32_0)(uVar10 | local_54 | uVar6 | uVar9);
      idx = idx + 1;
      uVar6 = (int)local_38 + 1;
      this_00.m_ptr = local_50.m_ptr;
    } while (idx != uVar7);
  }
  local_50.m_ptr = (Image *)0x0;
  AutoPtr<nv::Image>::~AutoPtr(&local_50);
  return this_00.m_ptr;
}

Assistant:

Image * FloatImage::createImage(uint base_component/*= 0*/, uint num/*= 4*/) const
{
	nvCheck(num <= 4);
	nvCheck(base_component + num <= m_componentNum);
	
	AutoPtr<Image> img(new Image());
	img->allocate(m_width, m_height);
	
	const uint size = m_width * m_height;
	for(uint i = 0; i < size; i++) {
		
		uint c;
		uint8 rgba[4]= {0, 0, 0, 0xff};

		for(c = 0; c < num; c++) {
			float f = m_mem[size * (base_component + c) + i];
			rgba[c] = nv::clamp(int(255.0f * f), 0, 255);
		}

		img->pixel(i) = Color32(rgba[0], rgba[1], rgba[2], rgba[3]);
	}
	
	return img.release();
}